

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

ostream * ccs::anon_unknown_0::operator<<(ostream *os,Type type)

{
  Type type_local;
  ostream *os_local;
  
  switch(type) {
  case EOS:
    std::operator<<(os,"end-of-input");
    break;
  case LPAREN:
    std::operator<<(os,"\'(\'");
    break;
  case RPAREN:
    std::operator<<(os,"\')");
    break;
  case LBRACE:
    std::operator<<(os,"\'{\'");
    break;
  case RBRACE:
    std::operator<<(os,"\'}\'");
    break;
  case SEMI:
    std::operator<<(os,"\';\'");
    break;
  case COLON:
    std::operator<<(os,"\':\'");
    break;
  case COMMA:
    std::operator<<(os,"\',\'");
    break;
  case DOT:
    std::operator<<(os,"\'.\'");
    break;
  case GT:
    std::operator<<(os,"\'>\'");
    break;
  case EQ:
    std::operator<<(os,"\'=\'");
    break;
  case SLASH:
    std::operator<<(os,"\'/\'");
    break;
  case CONSTRAIN:
    std::operator<<(os,"\'@constrain\'");
    break;
  case CONTEXT:
    std::operator<<(os,"\'@context\'");
    break;
  case IMPORT:
    std::operator<<(os,"\'@import\'");
    break;
  case OVERRIDE:
    std::operator<<(os,"\'@override\'");
    break;
  case INT:
    std::operator<<(os,"integer");
    break;
  case DOUBLE:
    std::operator<<(os,"double");
    break;
  case IDENT:
    std::operator<<(os,"identifier");
    break;
  case NUMID:
    std::operator<<(os,"numeric/identifier");
    break;
  case STRING:
    std::operator<<(os,"string literal");
  }
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, Token::Type type) {
  switch (type) {
  case Token::EOS: os << "end-of-input"; break;
  case Token::LPAREN: os << "'('"; break;
  case Token::RPAREN: os << "')"; break;
  case Token::LBRACE: os << "'{'"; break;
  case Token::RBRACE: os << "'}'"; break;
  case Token::SEMI: os << "';'"; break;
  case Token::COLON: os << "':'"; break;
  case Token::COMMA: os << "','"; break;
  case Token::DOT: os << "'.'"; break;
  case Token::GT: os << "'>'"; break;
  case Token::EQ: os << "'='"; break;
  case Token::SLASH: os << "'/'"; break;
  case Token::CONSTRAIN: os << "'@constrain'"; break;
  case Token::CONTEXT: os << "'@context'"; break;
  case Token::IMPORT: os << "'@import'"; break;
  case Token::OVERRIDE: os << "'@override'"; break;
  case Token::INT: os << "integer"; break;
  case Token::DOUBLE: os << "double"; break;
  case Token::IDENT: os << "identifier"; break;
  case Token::NUMID: os << "numeric/identifier"; break;
  case Token::STRING: os << "string literal"; break;
  }
  return os;
}